

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImVec2 ImGui::CalcTextSize(char *text,char *text_end,bool hide_text_after_double_hash,
                          float wrap_width)

{
  float size;
  undefined1 auVar1 [16];
  char *pcVar2;
  undefined7 in_register_00000011;
  char *pcVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [64];
  undefined1 extraout_var [56];
  
  if ((int)CONCAT71(in_register_00000011,hide_text_after_double_hash) != 0) {
    pcVar3 = (char *)(-(ulong)(text_end == (char *)0x0) | (ulong)text_end);
    pcVar2 = text;
    if (pcVar3 <= text) {
      size = GImGui->FontSize;
      goto LAB_0014bfe6;
    }
    do {
      text_end = pcVar2;
      if (*pcVar2 == '#') {
        if (pcVar2[1] == '#') break;
      }
      else if (*pcVar2 == '\0') break;
      pcVar2 = pcVar2 + 1;
      text_end = pcVar3;
    } while (pcVar2 != pcVar3);
  }
  size = GImGui->FontSize;
  if (text_end != text) {
    auVar5._0_8_ = ImFont::CalcTextSizeA
                             (GImGui->Font,size,3.4028235e+38,wrap_width,text,text_end,(char **)0x0)
    ;
    auVar5._8_56_ = extraout_var;
    auVar1 = vcvtdq2ps_avx(ZEXT416((uint)(int)(auVar5._0_4_ + 0.99999)));
    auVar4._4_12_ = auVar5._4_12_;
    auVar4._0_4_ = auVar1._0_4_;
    return auVar4._0_8_;
  }
LAB_0014bfe6:
  auVar1 = vinsertps_avx(ZEXT416((uint)size),ZEXT416((uint)size),0x1d);
  return auVar1._0_8_;
}

Assistant:

ImVec2 ImGui::CalcTextSize(const char* text, const char* text_end, bool hide_text_after_double_hash, float wrap_width)
{
    ImGuiContext& g = *GImGui;

    const char* text_display_end;
    if (hide_text_after_double_hash)
        text_display_end = FindRenderedTextEnd(text, text_end);      // Hide anything after a '##' string
    else
        text_display_end = text_end;

    ImFont* font = g.Font;
    const float font_size = g.FontSize;
    if (text == text_display_end)
        return ImVec2(0.0f, font_size);
    ImVec2 text_size = font->CalcTextSizeA(font_size, FLT_MAX, wrap_width, text, text_display_end, NULL);

    // Round
    // FIXME: This has been here since Dec 2015 (7b0bf230) but down the line we want this out.
    // FIXME: Investigate using ceilf or e.g.
    // - https://git.musl-libc.org/cgit/musl/tree/src/math/ceilf.c
    // - https://embarkstudios.github.io/rust-gpu/api/src/libm/math/ceilf.rs.html
    text_size.x = IM_FLOOR(text_size.x + 0.99999f);

    return text_size;
}